

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::CreateDestroyAmountTransaction
          (RawTransactionResponseStruct *__return_storage_ptr__,
          CreateDestroyAmountRequestStruct *request)

{
  CreateDestroyAmountRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateDestroyAmountRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateDestroyAmountRequestStruct *request_local;
  RawTransactionResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::CreateDestroyAmountRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::CreateDestroyAmountTransaction(cfd::js::api::CreateDestroyAmountRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::CreateDestroyAmountRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateDestroyAmountTransaction",&local_129);
  ExecuteStructApi<cfd::js::api::CreateDestroyAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateDestroyAmountRequestStruct *)local_108,&local_128,in_R8);
  RawTransactionResponseStruct::operator=
            (__return_storage_ptr__,(RawTransactionResponseStruct *)(local_108 + 0x20));
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  ::~function((function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct
ElementsTransactionStructApi::CreateDestroyAmountTransaction(
    const CreateDestroyAmountRequestStruct& request) {
  auto call_func = [](const CreateDestroyAmountRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;
    // Transaction作成
    ElementsAddressFactory address_factory;
    // Transaction作成
    std::vector<ConfidentialTxIn> txins;
    std::vector<ConfidentialTxOut> txouts;

    // TxInの追加
    for (const auto& txin_req : request.txins) {
      txins.emplace_back(
          Txid(txin_req.txid), txin_req.vout, txin_req.sequence);
    }

    // TxOutの追加
    Script script;
    for (const auto& txout_req : request.txouts) {
      const std::string& addr = txout_req.address;
      Amount amount(Amount::CreateBySatoshiAmount(txout_req.amount));
      ConfidentialAssetId asset(txout_req.asset);
      if (!txout_req.direct_locking_script.empty()) {
        txouts.emplace_back(
            Script(txout_req.direct_locking_script), asset,
            ConfidentialValue(amount),
            ConfidentialNonce(txout_req.direct_nonce), ByteData(), ByteData());
      } else {
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          if (txout_req.is_remove_nonce) {
            txouts.emplace_back(
                confidential_addr.GetUnblindedAddress(), asset, amount);
          } else {
            txouts.emplace_back(confidential_addr, asset, amount);
          }
        } else {
          ConfidentialTxOut txout(
              address_factory.GetAddress(addr), asset, amount);
          txout.SetNonce(ConfidentialNonce(txout_req.direct_nonce));
          txouts.emplace_back(txout);
        }
      }
    }

    // DestroyのTxOut追加
    ConfidentialTxOut destroy_txout =
        ConfidentialTxOut::CreateDestroyAmountTxOut(
            ConfidentialAssetId(request.destroy.asset),
            Amount::CreateBySatoshiAmount(request.destroy.amount));
    destroy_txout.SetNonce(ConfidentialNonce(request.destroy.direct_nonce));
    txouts.push_back(destroy_txout);

    // feeの追加
    ConfidentialTxOut txout_fee;
    auto& fee_req = request.fee;
    // amountが0のfeeは無効と判定
    if (fee_req.amount != 0) {
      txout_fee = ConfidentialTxOut(
          ConfidentialAssetId(fee_req.asset),
          Amount::CreateBySatoshiAmount(fee_req.amount));
    }

    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc = api.CreateRawTransaction(
        request.version, request.locktime, txins, txouts, txout_fee);

    response.hex = ctxc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      CreateDestroyAmountRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}